

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall leveldb::CorruptionTest::CorruptionTest(CorruptionTest *this)

{
  void *in_RAX;
  Cache *pCVar1;
  void *local_28;
  
  local_28 = in_RAX;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CorruptionTest_0017eff8;
  test::ErrorEnv::ErrorEnv(&this->env_);
  Options::Options(&this->options_);
  this->db_ = (DB *)0x0;
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->dbname_,"/memenv/corruption_test","");
  pCVar1 = NewLRUCache(100);
  this->tiny_cache_ = pCVar1;
  (this->options_).env = (Env *)&this->env_;
  (this->options_).block_cache = pCVar1;
  DestroyDB((leveldb *)&local_28,&this->dbname_,&this->options_);
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  (this->options_).create_if_missing = true;
  Reopen(this);
  (this->options_).create_if_missing = false;
  return;
}

Assistant:

CorruptionTest()
      : db_(nullptr),
        dbname_("/memenv/corruption_test"),
        tiny_cache_(NewLRUCache(100)) {
    options_.env = &env_;
    options_.block_cache = tiny_cache_;
    DestroyDB(dbname_, options_);

    options_.create_if_missing = true;
    Reopen();
    options_.create_if_missing = false;
  }